

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.hpp
# Opt level: O3

vector<unsigned_long,_std::allocator<unsigned_long>_> *
primesum::generate_prime_sums<unsigned_long>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,int64_t max
          )

{
  pointer puVar1;
  ulong uVar2;
  unsigned_long uVar3;
  ulong uVar4;
  initializer_list<unsigned_long> __l;
  allocator_type local_19;
  unsigned_long local_18;
  
  local_18 = 0;
  __l._M_len = 1;
  __l._M_array = &local_18;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,__l,&local_19);
  primesieve::store_primes<std::vector<unsigned_long,std::allocator<unsigned_long>>>
            (0,max,__return_storage_ptr__);
  puVar1 = (__return_storage_ptr__->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = (long)(__return_storage_ptr__->
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
  if (1 < uVar2) {
    uVar3 = *puVar1;
    uVar4 = 1;
    do {
      uVar3 = uVar3 + puVar1[uVar4];
      puVar1[uVar4] = uVar3;
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> generate_prime_sums(int64_t max)
{
  std::vector<T> primes = { 0 };
  primesieve::generate_primes(max, &primes);

  for (uint64_t i = 1; i < primes.size(); i++)
    primes[i] += primes[i - 1];

  return primes;
}